

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioReadAiger.c
# Opt level: O1

Abc_Ntk_t * Io_ReadAiger(char *pFileName,int fCheck)

{
  byte bVar1;
  long *plVar2;
  Abc_Ntk_t **ppAVar3;
  byte bVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  size_t sVar9;
  FILE *pFVar10;
  Abc_Obj_t *pAVar11;
  BZFILE *b;
  gzFile file;
  void *buf;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  Abc_Ntk_t *pAVar12;
  char *pcVar13;
  uint *puVar14;
  void *pvVar15;
  Abc_Obj_t *pAVar16;
  Abc_Obj_t *pAVar17;
  ProgressBar *pPVar18;
  undefined8 uVar19;
  Abc_Obj_t *pAVar20;
  Vec_Ptr_t *pVVar21;
  byte bVar22;
  uint uVar23;
  uint uVar24;
  void *__src;
  ulong uVar25;
  uint uVar26;
  uint uVar27;
  char *pcVar28;
  Vec_Int_t *p;
  uint uVar29;
  uint uVar30;
  long lVar31;
  void *pvVar32;
  byte *pbVar33;
  Abc_Obj_t *pAVar34;
  Vec_Ptr_t **ppVVar35;
  bool bVar36;
  bool bVar37;
  Abc_Obj_t *local_98;
  Abc_Ntk_t *local_90;
  FILE *local_88;
  Vec_Int_t *local_80;
  Abc_Obj_t *local_78;
  ProgressBar *local_70;
  int local_68;
  int local_64;
  Abc_Obj_t *local_60;
  uint local_54;
  ProgressBar *local_50;
  undefined4 local_44;
  Abc_Obj_t *local_40;
  Abc_Obj_t *local_38;
  
  sVar9 = strlen(pFileName);
  iVar5 = strncmp(pFileName + (sVar9 - 4),".bz2",4);
  if (iVar5 != 0) {
    iVar5 = strncmp(pFileName + (sVar9 - 3),".gz",3);
    if (iVar5 == 0) {
      file = gzopen(pFileName,"rb");
      pAVar11 = (Abc_Obj_t *)malloc(100000);
      lVar31 = 0;
      while (iVar5 = gzread(file,(byte *)((long)&pAVar11->pNtk + lVar31),100000), iVar5 == 100000) {
        if (pAVar11 == (Abc_Obj_t *)0x0) {
          pAVar11 = (Abc_Obj_t *)malloc(lVar31 + 200000U);
        }
        else {
          pAVar11 = (Abc_Obj_t *)realloc(pAVar11,lVar31 + 200000U);
        }
        lVar31 = lVar31 + 100000;
      }
      if (iVar5 == -1) {
        __assert_fail("amtRead != -1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/io/ioReadAiger.c"
                      ,0xd7,"char *Ioa_ReadLoadFileGzAig(char *, int *)");
      }
      iVar5 = iVar5 + (int)lVar31;
      gzclose(file);
      goto LAB_0087c744;
    }
    iVar5 = Extra_FileSize(pFileName);
    pFVar10 = fopen(pFileName,"rb");
    pAVar11 = (Abc_Obj_t *)malloc((long)iVar5);
    fread(pAVar11,(long)iVar5,1,pFVar10);
    goto LAB_0087c4cd;
  }
  pFVar10 = fopen(pFileName,"rb");
  if (pFVar10 == (FILE *)0x0) {
    puts("Ioa_ReadLoadFileBz2(): The file is unavailable (absent or open).");
    iVar5 = -1;
    pAVar11 = (Abc_Obj_t *)0x0;
    goto LAB_0087c744;
  }
  iVar5 = 0;
  local_90 = (Abc_Ntk_t *)pFileName;
  b = BZ2_bzReadOpen(&local_64,(FILE *)pFVar10,0,0,(void *)0x0,0);
  if (local_64 == 0) {
    pvVar15 = (void *)0x0;
    pvVar32 = (void *)0x0;
    local_88 = pFVar10;
    local_68 = fCheck;
    do {
      buf = malloc(0x100010);
      __src = buf;
      if (pvVar32 != (void *)0x0) {
        *(void **)((long)pvVar15 + 0x100008) = buf;
        __src = pvVar32;
      }
      iVar6 = BZ2_bzRead(&local_64,b,buf,0x100000);
      fCheck = local_68;
      *(int *)((long)buf + 0x100000) = iVar6;
      iVar5 = iVar5 + iVar6;
      *(undefined8 *)((long)buf + 0x100008) = 0;
      pvVar15 = buf;
      pvVar32 = __src;
    } while (local_64 == 0);
    if (local_64 == -5) {
      BZ2_bzReadClose(&local_64,b);
      pFVar10 = local_88;
      fseek(local_88,0,2);
      lVar31 = ftell(pFVar10);
      fCheck = local_68;
      iVar5 = (int)lVar31;
      if (iVar5 == 0) {
        pcVar28 = "Ioa_ReadLoadFileBz2(): The file is empty.";
        goto LAB_0087c732;
      }
      pAVar11 = (Abc_Obj_t *)malloc((long)(iVar5 + 10));
      rewind(pFVar10);
      fread(pAVar11,(long)iVar5,1,pFVar10);
      pFileName = (char *)local_90;
    }
    else {
      if (local_64 != 4) {
        pcVar28 = "Ioa_ReadLoadFileBz2(): Unable to read the compressed BLIF.";
LAB_0087c732:
        fCheck = local_68;
        puts(pcVar28);
        goto LAB_0087c73f;
      }
      BZ2_bzReadClose(&local_64,b);
      pAVar11 = (Abc_Obj_t *)malloc((long)(iVar5 + 10));
      iVar6 = 0;
      do {
        memcpy((byte *)((long)&pAVar11->pNtk + (long)iVar6),__src,
               (long)*(int *)((long)__src + 0x100000));
        iVar6 = iVar6 + *(int *)((long)__src + 0x100000);
        pvVar15 = *(void **)((long)__src + 0x100008);
        if (__src != (void *)0x0) {
          free(__src);
        }
        pFVar10 = local_88;
        __src = pvVar15;
        pFileName = (char *)local_90;
      } while (pvVar15 != (void *)0x0);
    }
LAB_0087c4cd:
    fclose(pFVar10);
  }
  else {
    printf("Ioa_ReadLoadFileBz2(): BZ2_bzReadOpen() failed with error %d.\n");
LAB_0087c73f:
    pAVar11 = (Abc_Obj_t *)0x0;
    iVar5 = -1;
    pFileName = (char *)local_90;
  }
LAB_0087c744:
  iVar6 = strncmp((char *)pAVar11,"aig",3);
  if ((iVar6 == 0) &&
     ((bVar4 = *(byte *)((long)&pAVar11->pNtk + 3), pAVar16 = pAVar11, bVar4 == 0x32 ||
      (bVar4 == 0x20)))) {
    do {
      ppAVar3 = &pAVar16->pNtk;
      pAVar16 = (Abc_Obj_t *)((long)&pAVar16->pNtk + 1);
    } while (*(byte *)ppAVar3 != 0x20);
    local_98 = pAVar16;
    local_60 = pAVar11;
    iVar6 = atoi((char *)pAVar16);
    local_90 = (Abc_Ntk_t *)CONCAT44(local_90._4_4_,iVar6);
    do {
      ppAVar3 = &pAVar16->pNtk;
      pAVar16 = (Abc_Obj_t *)((long)&pAVar16->pNtk + 1);
    } while (*(byte *)ppAVar3 != 0x20);
    local_98 = pAVar16;
    iVar6 = atoi((char *)pAVar16);
    do {
      ppAVar3 = &pAVar16->pNtk;
      pAVar16 = (Abc_Obj_t *)((long)&pAVar16->pNtk + 1);
    } while (*(byte *)ppAVar3 != 0x20);
    local_98 = pAVar16;
    iVar7 = atoi((char *)pAVar16);
    local_80 = (Vec_Int_t *)CONCAT44(extraout_var,iVar7);
    do {
      ppAVar3 = &pAVar16->pNtk;
      pAVar16 = (Abc_Obj_t *)((long)&pAVar16->pNtk + 1);
    } while (*(byte *)ppAVar3 != 0x20);
    local_98 = pAVar16;
    iVar7 = atoi((char *)pAVar16);
    do {
      ppAVar3 = &pAVar16->pNtk;
      pAVar16 = (Abc_Obj_t *)((long)&pAVar16->pNtk + 1);
    } while (*(byte *)ppAVar3 != 0x20);
    local_98 = pAVar16;
    iVar8 = atoi((char *)pAVar16);
    local_78 = (Abc_Obj_t *)CONCAT44(extraout_var_00,iVar8);
    do {
      ppAVar3 = &pAVar16->pNtk;
      if (*(byte *)ppAVar3 == 10) {
        local_44 = 0;
        local_98 = pAVar16;
        goto LAB_0087c877;
      }
      pAVar16 = (Abc_Obj_t *)((long)&pAVar16->pNtk + 1);
    } while (*(byte *)ppAVar3 != 0x20);
    local_98 = pAVar16;
    iVar8 = atoi((char *)pAVar16);
    for (; (*(byte *)&pAVar16->pNtk != 10 && (*(byte *)&pAVar16->pNtk != 0x20));
        pAVar16 = (Abc_Obj_t *)((long)&pAVar16->pNtk + 1)) {
    }
    iVar7 = iVar7 + iVar8;
    local_44 = CONCAT31((int3)((uint)iVar8 >> 8),iVar8 != 0);
    local_98 = pAVar16;
LAB_0087c877:
    local_54 = 0;
    if (*(byte *)&local_98->pNtk == 0x20) {
      pAVar11 = (Abc_Obj_t *)((long)&local_98->pNtk + 1);
      local_98 = pAVar11;
      local_54 = atoi((char *)pAVar11);
      for (; (*(byte *)&pAVar11->pNtk != 10 && (*(byte *)&pAVar11->pNtk != 0x20));
          pAVar11 = (Abc_Obj_t *)((long)&pAVar11->pNtk + 1)) {
      }
      iVar7 = iVar7 + local_54;
      local_98 = pAVar11;
    }
    if (*(byte *)&local_98->pNtk == 0x20) {
      pAVar11 = (Abc_Obj_t *)((long)&local_98->pNtk + 1);
      local_98 = pAVar11;
      iVar8 = atoi((char *)pAVar11);
      for (; (*(byte *)&pAVar11->pNtk != 10 && (*(byte *)&pAVar11->pNtk != 0x20));
          pAVar11 = (Abc_Obj_t *)((long)&pAVar11->pNtk + 1)) {
      }
      local_70 = (ProgressBar *)CONCAT44(local_70._4_4_,iVar7 + iVar8);
      bVar36 = iVar8 != 0;
      local_98 = pAVar11;
    }
    else {
      local_70 = (ProgressBar *)CONCAT44(local_70._4_4_,iVar7);
      bVar36 = false;
    }
    if (*(byte *)&local_98->pNtk == 0x20) {
      pAVar11 = (Abc_Obj_t *)((long)&local_98->pNtk + 1);
      local_98 = pAVar11;
      iVar7 = atoi((char *)pAVar11);
      for (; (*(byte *)&pAVar11->pNtk != 10 && (*(byte *)&pAVar11->pNtk != 0x20));
          pAVar11 = (Abc_Obj_t *)((long)&pAVar11->pNtk + 1)) {
      }
      local_70 = (ProgressBar *)CONCAT44(local_70._4_4_,(int)local_70 + iVar7);
      bVar37 = iVar7 != 0;
      local_98 = pAVar11;
    }
    else {
      bVar37 = false;
    }
    if (*(byte *)&local_98->pNtk == 10) {
      local_98 = (Abc_Obj_t *)((long)&local_98->pNtk + 1);
      uVar26 = (int)local_80 + iVar6;
      local_50 = (ProgressBar *)(ulong)uVar26;
      iVar7 = (int)local_78 + uVar26;
      if ((int)local_90 == iVar7) {
        if (!(bool)(bVar36 | bVar37)) {
          local_88 = (FILE *)CONCAT44(local_88._4_4_,iVar7);
          if (local_54 != 0) {
            if (local_54 == 1) {
              fwrite("Warning: The last output is interpreted as a constraint.\n",0x39,1,_stdout);
            }
            else {
              fprintf(_stdout,"Warning: The last %d outputs are interpreted as constraints.\n",
                      (ulong)local_54);
            }
          }
          pAVar12 = Abc_NtkAlloc(ABC_NTK_STRASH,ABC_FUNC_AIG,1);
          pcVar28 = Extra_FileNameGeneric(pFileName);
          pcVar13 = Extra_UtilStrsav(pcVar28);
          pAVar12->pName = pcVar13;
          pcVar13 = Extra_UtilStrsav(pFileName);
          pAVar12->pSpec = pcVar13;
          local_90 = pAVar12;
          if (pcVar28 != (char *)0x0) {
            free(pcVar28);
          }
          local_90->nConstrs = local_54;
          iVar7 = (int)local_78;
          iVar8 = (int)local_50;
          puVar14 = (uint *)malloc(0x10);
          uVar26 = 8;
          if (6 < (uint)local_88) {
            uVar26 = iVar7 + iVar8 + 1;
          }
          puVar14[1] = 0;
          *puVar14 = uVar26;
          if (uVar26 == 0) {
            local_40 = (Abc_Obj_t *)0x0;
          }
          else {
            local_40 = (Abc_Obj_t *)malloc((long)(int)uVar26 << 3);
          }
          *(Abc_Obj_t **)(puVar14 + 2) = local_40;
          pAVar11 = Abc_AigConst1(local_90);
          if (uVar26 == 0) {
            if (local_40 == (Abc_Obj_t *)0x0) {
              pvVar15 = malloc(0x80);
            }
            else {
              pvVar15 = realloc(local_40,0x80);
            }
            *(void **)(puVar14 + 2) = pvVar15;
            *puVar14 = 0x10;
          }
          puVar14[1] = 1;
          **(ulong **)(puVar14 + 2) = (ulong)pAVar11 ^ 1;
          local_68 = fCheck;
          if (0 < iVar6) {
            do {
              pAVar11 = Abc_NtkCreateObj(local_90,ABC_OBJ_PI);
              uVar26 = puVar14[1];
              uVar23 = *puVar14;
              if (uVar26 == uVar23) {
                if ((int)uVar23 < 0x10) {
                  if (*(void **)(puVar14 + 2) == (void *)0x0) {
                    pvVar15 = malloc(0x80);
                  }
                  else {
                    pvVar15 = realloc(*(void **)(puVar14 + 2),0x80);
                  }
                  uVar27 = 0x10;
                }
                else {
                  uVar27 = uVar23 * 2;
                  if ((int)uVar27 <= (int)uVar23) goto LAB_0087cba9;
                  if (*(void **)(puVar14 + 2) == (void *)0x0) {
                    pvVar15 = malloc((ulong)uVar23 << 4);
                  }
                  else {
                    pvVar15 = realloc(*(void **)(puVar14 + 2),(ulong)uVar23 << 4);
                  }
                }
                *(void **)(puVar14 + 2) = pvVar15;
                *puVar14 = uVar27;
              }
LAB_0087cba9:
              puVar14[1] = uVar26 + 1;
              *(Abc_Obj_t **)(*(long *)(puVar14 + 2) + (long)(int)uVar26 * 8) = pAVar11;
              iVar6 = iVar6 + -1;
            } while (iVar6 != 0);
          }
          pAVar12 = local_90;
          iVar6 = (int)local_70;
          if (0 < (int)local_70) {
            do {
              Abc_NtkCreateObj(pAVar12,ABC_OBJ_PO);
              iVar6 = iVar6 + -1;
            } while (iVar6 != 0);
          }
          if (0 < (int)local_80) {
            uVar25 = (ulong)local_80 & 0xffffffff;
            do {
              pAVar11 = Abc_NtkCreateObj(pAVar12,ABC_OBJ_LATCH);
              if ((*(uint *)&pAVar11->field_0x14 & 0xf) != 8) {
                __assert_fail("Abc_ObjIsLatch(pLatch)",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abc.h"
                              ,0x1a4,"void Abc_LatchSetInit0(Abc_Obj_t *)");
              }
              pAVar11->field_5 = (anon_union_8_2_00a17ec8_for_Abc_Obj_t__15)0x1;
              pAVar16 = Abc_NtkCreateObj(pAVar12,ABC_OBJ_BI);
              pAVar17 = Abc_NtkCreateObj(pAVar12,ABC_OBJ_BO);
              Abc_ObjAddFanin(pAVar11,pAVar16);
              Abc_ObjAddFanin(pAVar17,pAVar11);
              uVar26 = puVar14[1];
              uVar23 = *puVar14;
              if (uVar26 == uVar23) {
                if ((int)uVar23 < 0x10) {
                  if (*(void **)(puVar14 + 2) == (void *)0x0) {
                    pvVar15 = malloc(0x80);
                  }
                  else {
                    pvVar15 = realloc(*(void **)(puVar14 + 2),0x80);
                  }
                  uVar27 = 0x10;
                }
                else {
                  uVar27 = uVar23 * 2;
                  if ((int)uVar27 <= (int)uVar23) goto LAB_0087ccc0;
                  if (*(void **)(puVar14 + 2) == (void *)0x0) {
                    pvVar15 = malloc((ulong)uVar23 << 4);
                  }
                  else {
                    pvVar15 = realloc(*(void **)(puVar14 + 2),(ulong)uVar23 << 4);
                  }
                }
                *(void **)(puVar14 + 2) = pvVar15;
                *puVar14 = uVar27;
              }
LAB_0087ccc0:
              puVar14[1] = uVar26 + 1;
              *(Abc_Obj_t **)(*(long *)(puVar14 + 2) + (long)(int)uVar26 * 8) = pAVar17;
              uVar26 = (int)uVar25 - 1;
              uVar25 = (ulong)uVar26;
              pAVar12 = local_90;
            } while (uVar26 != 0);
          }
          pAVar11 = local_60;
          local_88 = (FILE *)puVar14;
          if (*(byte *)((long)&local_60->pNtk + 3) == 0x20) {
            iVar6 = (int)local_70 + (int)local_80;
            pAVar16 = local_98;
            if (iVar6 != 0 && SCARRY4((int)local_70,(int)local_80) == iVar6 < 0) {
              iVar7 = 0;
              pAVar17 = local_98;
              do {
                pAVar16 = (Abc_Obj_t *)((long)&pAVar17->pNtk + 1);
                iVar7 = iVar7 + (uint)(*(byte *)&pAVar17->pNtk == 10);
                pAVar17 = pAVar16;
              } while (iVar7 < iVar6);
            }
            local_38 = local_98;
            local_80 = (Vec_Int_t *)0x0;
            local_98 = pAVar16;
          }
          else {
            local_80 = Io_WriteDecodeLiterals((char **)&local_98,(int)local_70 + (int)local_80);
            local_38 = (Abc_Obj_t *)0x0;
          }
          iVar6 = (int)local_78;
          pPVar18 = Extra_ProgressBarStart((FILE *)_stdout,iVar6);
          pAVar16 = local_98;
          if (0 < iVar6) {
            iVar6 = 0;
            local_70 = pPVar18;
            do {
              if ((local_70 == (ProgressBar *)0x0) || (local_70->nItemsNext <= iVar6)) {
                Extra_ProgressBarUpdate_int(local_70,iVar6,(char *)0x0);
              }
              pFVar10 = local_88;
              uVar26 = (uint)*(byte *)&pAVar16->pNtk;
              pbVar33 = (byte *)((long)&pAVar16->pNtk + 1);
              bVar4 = 0;
              if ((char)*(byte *)&pAVar16->pNtk < '\0') {
                bVar22 = 0;
                uVar23 = 0;
                do {
                  uVar23 = uVar23 | (uVar26 & 0x7f) << (bVar22 & 0x1f);
                  bVar1 = *pbVar33;
                  uVar26 = (uint)bVar1;
                  pbVar33 = pbVar33 + 1;
                  bVar22 = bVar22 + 7;
                } while ((char)bVar1 < '\0');
              }
              else {
                bVar22 = 0;
                uVar23 = 0;
              }
              uVar27 = (uint)*pbVar33;
              pAVar16 = (Abc_Obj_t *)(pbVar33 + 1);
              if ((char)*pbVar33 < '\0') {
                bVar4 = 0;
                uVar29 = 0;
                do {
                  uVar29 = uVar29 | (uVar27 & 0x7f) << (bVar4 & 0x1f);
                  ppAVar3 = &pAVar16->pNtk;
                  uVar27 = (uint)*(byte *)ppAVar3;
                  pAVar16 = (Abc_Obj_t *)((long)&pAVar16->pNtk + 1);
                  bVar4 = bVar4 + 7;
                } while ((char)*(byte *)ppAVar3 < '\0');
              }
              else {
                uVar29 = 0;
              }
              uVar30 = (int)local_50 + iVar6 + 1;
              uVar24 = uVar30 * 2 - (uVar26 << (bVar22 & 0x1f) | uVar23);
              uVar27 = uVar24 - (uVar27 << (bVar4 & 0x1f) | uVar29);
              uVar23 = uVar27 >> 1;
              uVar26 = *(uint *)((long)local_88 + 4);
              pAVar17 = pAVar16;
              if (((int)uVar26 <= (int)uVar23) || ((int)uVar26 <= (int)(uVar24 >> 1)))
              goto LAB_0087d6b1;
              if (uVar26 != uVar30) {
                local_98 = pAVar16;
                __assert_fail("Vec_PtrSize(vNodes) == i + 1 + nInputs + nLatches",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/io/ioReadAiger.c"
                              ,0x199,"Abc_Ntk_t *Io_ReadAiger(char *, int)");
              }
              pvVar15 = *(void **)((long)local_88 + 8);
              pAVar11 = Abc_AigAnd((Abc_Aig_t *)local_90->pManFunc,
                                   (Abc_Obj_t *)
                                   ((ulong)(uVar27 & 1) ^
                                   *(ulong *)((long)pvVar15 + (ulong)uVar23 * 8)),
                                   (Abc_Obj_t *)
                                   ((ulong)(uVar24 & 1) ^
                                   *(ulong *)((long)pvVar15 + (ulong)(uVar24 >> 1) * 8)));
              uVar23 = *(uint *)pFVar10;
              if (uVar26 == uVar23) {
                if ((int)uVar23 < 0x10) {
                  if (pvVar15 == (void *)0x0) {
                    local_40 = pAVar11;
                    pvVar15 = malloc(0x80);
                  }
                  else {
                    local_40 = pAVar11;
                    pvVar15 = realloc(pvVar15,0x80);
                  }
                  uVar27 = 0x10;
                }
                else {
                  uVar27 = uVar23 * 2;
                  pFVar10 = local_88;
                  if ((int)uVar27 <= (int)uVar23) goto LAB_0087ceed;
                  if (pvVar15 == (void *)0x0) {
                    local_40 = pAVar11;
                    pvVar15 = malloc((ulong)uVar23 << 4);
                  }
                  else {
                    local_40 = pAVar11;
                    pvVar15 = realloc(pvVar15,(ulong)uVar23 << 4);
                  }
                }
                *(void **)((long)local_88 + 8) = pvVar15;
                *(uint *)local_88 = uVar27;
                pAVar11 = local_40;
                pFVar10 = local_88;
              }
LAB_0087ceed:
              iVar6 = iVar6 + 1;
              *(uint *)((long)pFVar10 + 4) = uVar26 + 1;
              *(Abc_Obj_t **)(*(long *)((long)pFVar10 + 8) + (long)(int)uVar26 * 8) = pAVar11;
              pPVar18 = local_70;
              pAVar11 = local_60;
              pAVar12 = local_90;
            } while (iVar6 != (int)local_78);
          }
          local_98 = pAVar16;
          Extra_ProgressBarStop(pPVar18);
          local_98 = local_38;
          pVVar21 = pAVar12->vBoxes;
          if (*(byte *)((long)&pAVar11->pNtk + 3) == 0x20) {
            pFVar10 = local_88;
            if (0 < pVVar21->nSize) {
              uVar25 = 0;
              pAVar17 = local_38;
              do {
                pPVar18 = (ProgressBar *)pVVar21->pArray[uVar25];
                pAVar12 = local_90;
                if (((ulong)pPVar18->pFile & 0xf00000000) == 0x800000000) {
                  local_78 = *(Abc_Obj_t **)
                              (*(long *)(*(long *)(*(long *)pPVar18 + 0x20) + 8) +
                              (long)**(int **)&pPVar18[1].posTotal * 8);
                  local_50 = pPVar18;
                  uVar26 = atoi((char *)pAVar17);
LAB_0087cf9e:
                  if (*(byte *)&pAVar17->pNtk != 10) {
                    if (*(byte *)&pAVar17->pNtk != 0x20) goto code_r0x0087cfac;
                    pAVar17 = (Abc_Obj_t *)((long)&pAVar17->pNtk + 1);
                    local_98 = pAVar17;
                    iVar6 = atoi((char *)pAVar17);
                    if (iVar6 == 1) {
                      uVar19 = 2;
                    }
                    else if (iVar6 == 0) {
                      uVar19 = 1;
                    }
                    else {
                      iVar7 = local_90->vPis->nSize + (int)uVar25 + 1;
                      if (iVar7 < 0) {
                        __assert_fail("Var >= 0 && !(c >> 1)",
                                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                                      ,0x12e,"int Abc_Var2Lit(int, int)");
                      }
                      if (iVar6 != iVar7 * 2) {
                        __assert_fail("Init == Abc_Var2Lit(1+Abc_NtkPiNum(pNtkNew)+i, 0)",
                                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/io/ioReadAiger.c"
                                      ,0x1b3,"Abc_Ntk_t *Io_ReadAiger(char *, int)");
                      }
                      uVar19 = 3;
                    }
                    local_50[2].posTotal = (int)uVar19;
                    local_50[2].posCur = (int)((ulong)uVar19 >> 0x20);
                    for (; (pFVar10 = local_88, *(byte *)&pAVar17->pNtk != 10 &&
                           (*(byte *)&pAVar17->pNtk != 0x20));
                        pAVar17 = (Abc_Obj_t *)((long)&pAVar17->pNtk + 1)) {
                    }
                  }
                  pAVar12 = local_90;
                  if (*(byte *)&pAVar17->pNtk != 10) {
                    local_98 = pAVar17;
                    fprintf(_stdout,"The initial value of latch number %d is not recongnized.\n",
                            uVar25 & 0xffffffff);
                    return (Abc_Ntk_t *)0x0;
                  }
                  pAVar17 = (Abc_Obj_t *)((long)&pAVar17->pNtk + 1);
                  if ((int)*(uint *)((long)pFVar10 + 4) <= (int)(uVar26 >> 1)) goto LAB_0087d6b1;
                  local_98 = pAVar17;
                  Abc_ObjAddFanin(local_78,(Abc_Obj_t *)
                                           ((ulong)(uVar26 & 1) ^
                                           *(ulong *)(*(long *)((long)pFVar10 + 8) +
                                                     (ulong)(uVar26 >> 1) * 8)));
                }
                uVar25 = uVar25 + 1;
                pVVar21 = pAVar12->vBoxes;
              } while ((long)uVar25 < (long)pVVar21->nSize);
            }
            pVVar21 = pAVar12->vPos;
            pAVar11 = local_60;
            if (0 < pVVar21->nSize) {
              uVar26 = *(uint *)((long)pFVar10 + 4);
              lVar31 = 0;
              pAVar17 = local_98;
              do {
                pAVar11 = (Abc_Obj_t *)pVVar21->pArray[lVar31];
                uVar23 = atoi((char *)pAVar17);
                do {
                  ppAVar3 = &pAVar17->pNtk;
                  pAVar17 = (Abc_Obj_t *)((long)&pAVar17->pNtk + 1);
                } while (*(byte *)ppAVar3 != 10);
                if ((int)uVar26 <= (int)(uVar23 >> 1)) goto LAB_0087d6b1;
                Abc_ObjAddFanin(pAVar11,(Abc_Obj_t *)
                                        ((ulong)(uVar23 & 1) ^
                                        *(ulong *)(*(long *)((long)local_88 + 8) +
                                                  (ulong)(uVar23 >> 1) * 8)));
                lVar31 = lVar31 + 1;
                pVVar21 = local_90->vPos;
                pAVar11 = local_60;
                pAVar12 = local_90;
              } while (lVar31 < pVVar21->nSize);
            }
          }
          else {
            p = local_80;
            if (0 < pVVar21->nSize) {
              lVar31 = 0;
              do {
                plVar2 = (long *)pVVar21->pArray[lVar31];
                if ((*(uint *)((long)plVar2 + 0x14) & 0xf) == 8) {
                  if (p->nSize <= lVar31) goto LAB_0087d6d0;
                  uVar26 = (uint)p->pArray[lVar31] >> 1;
                  pAVar17 = local_98;
                  if ((int)*(uint *)((long)local_88 + 4) <= (int)uVar26) goto LAB_0087d6b1;
                  Abc_ObjAddFanin(*(Abc_Obj_t **)
                                   (*(long *)(*(long *)(*plVar2 + 0x20) + 8) +
                                   (long)*(int *)plVar2[4] * 8),
                                  (Abc_Obj_t *)
                                  ((ulong)(p->pArray[lVar31] & 1) ^
                                  *(ulong *)(*(long *)((long)local_88 + 8) + (ulong)uVar26 * 8)));
                  p = local_80;
                }
                lVar31 = lVar31 + 1;
                pVVar21 = pAVar12->vBoxes;
              } while (lVar31 < pVVar21->nSize);
            }
            pVVar21 = pAVar12->vPos;
            if (0 < pVVar21->nSize) {
              lVar31 = 0;
              do {
                uVar25 = (ulong)(uint)pAVar12->nObjCounts[8] + lVar31;
                iVar6 = (int)uVar25;
                if ((iVar6 < 0) || (p->nSize <= iVar6)) {
LAB_0087d6d0:
                  __assert_fail("i >= 0 && i < p->nSize",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                                ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
                }
                uVar26 = (uint)p->pArray[uVar25 & 0xffffffff] >> 1;
                pAVar17 = local_98;
                if ((int)*(uint *)((long)local_88 + 4) <= (int)uVar26) goto LAB_0087d6b1;
                Abc_ObjAddFanin((Abc_Obj_t *)pVVar21->pArray[lVar31],
                                (Abc_Obj_t *)
                                ((ulong)(p->pArray[uVar25 & 0xffffffff] & 1) ^
                                *(ulong *)(*(long *)((long)local_88 + 8) + (ulong)uVar26 * 8)));
                lVar31 = lVar31 + 1;
                pVVar21 = pAVar12->vPos;
                p = local_80;
              } while (lVar31 < pVVar21->nSize);
            }
            Vec_IntFree(p);
          }
          local_78 = (Abc_Obj_t *)((long)&pAVar11->pNtk + (long)iVar5);
          if ((pAVar16 < local_78) && (*(byte *)&pAVar16->pNtk != 99)) {
            local_98 = pAVar16;
            if (pAVar16 < local_78) {
              local_50 = (ProgressBar *)&local_90->vPos;
              local_70 = (ProgressBar *)&local_90->vBoxes;
              ppVVar35 = &local_90->vPis;
              do {
                pAVar11 = local_98;
                bVar4 = *(byte *)&local_98->pNtk;
                pPVar18 = (ProgressBar *)ppVVar35;
                switch(bVar4) {
                case 0x62:
                case 0x66:
                case 0x6a:
                case 0x6f:
                  pPVar18 = local_50;
                  break;
                case 99:
                  goto switchD_0087d386_caseD_63;
                default:
                  return (Abc_Ntk_t *)0x0;
                case 0x69:
                  break;
                case 0x6c:
                  pPVar18 = local_70;
                }
                lVar31 = *(long *)pPVar18;
                pAVar17 = (Abc_Obj_t *)((long)&local_98->pNtk + 1);
                local_98 = pAVar17;
                uVar26 = atoi((char *)pAVar17);
                do {
                  ppAVar3 = &pAVar17->pNtk;
                  pAVar17 = (Abc_Obj_t *)((long)&pAVar17->pNtk + 1);
                } while (*(byte *)ppAVar3 != 0x20);
                if (*(int *)(lVar31 + 4) <= (int)uVar26) {
                  local_98 = pAVar17;
                  fwrite("The number of terminal is out of bound.\n",0x28,1,_stdout);
                  return (Abc_Ntk_t *)0x0;
                }
                if ((int)uVar26 < 0) {
LAB_0087d6b1:
                  local_98 = pAVar17;
                  __assert_fail("i >= 0 && i < p->nSize",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                                ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
                }
                pAVar34 = *(Abc_Obj_t **)(*(long *)(lVar31 + 8) + (ulong)uVar26 * 8);
                local_98 = pAVar17;
                if (bVar4 == 0x6c) {
                  pAVar34 = (Abc_Obj_t *)pAVar34->pNtk->vObjs->pArray[*(pAVar34->vFanouts).pArray];
                }
                do {
                  pAVar20 = local_98;
                  local_98 = (Abc_Obj_t *)((long)&pAVar20->pNtk + 1);
                } while (*(byte *)&pAVar20->pNtk != 10);
                *(byte *)&pAVar20->pNtk = 0;
                Abc_ObjAssignName(pAVar34,(char *)pAVar17,(char *)0x0);
                if (*(byte *)&pAVar11->pNtk == 0x6c) {
                  pAVar11 = (Abc_Obj_t *)pAVar34->pNtk->vObjs->pArray[*(pAVar34->vFanins).pArray];
                  pcVar28 = Abc_ObjName(pAVar34);
                  Abc_ObjAssignName(pAVar11,pcVar28,"L");
                  plVar2 = (long *)pAVar34->pNtk->vObjs->pArray[*(pAVar34->vFanins).pArray];
                  pAVar11 = *(Abc_Obj_t **)
                             (*(long *)(*(long *)(*plVar2 + 0x20) + 8) + (long)*(int *)plVar2[4] * 8
                             );
                  pcVar28 = Abc_ObjName(pAVar34);
                  Abc_ObjAssignName(pAVar11,pcVar28,"_in");
                }
                pcVar28 = Abc_ObjName(pAVar34);
                (pAVar34->field_6).pTemp = pcVar28;
              } while (local_98 < local_78);
            }
switchD_0087d386_caseD_63:
            pVVar21 = local_90->vPis;
            if (0 < pVVar21->nSize) {
              lVar31 = 0;
              do {
                pAVar11 = (Abc_Obj_t *)pVVar21->pArray[lVar31];
                if ((pAVar11->field_6).pTemp == (void *)0x0) {
                  pcVar28 = Abc_ObjName(pAVar11);
                  Abc_ObjAssignName(pAVar11,pcVar28,(char *)0x0);
                }
                lVar31 = lVar31 + 1;
                pVVar21 = local_90->vPis;
              } while (lVar31 < pVVar21->nSize);
            }
            pVVar21 = local_90->vBoxes;
            pAVar11 = local_60;
            if (0 < pVVar21->nSize) {
              lVar31 = 0;
              do {
                plVar2 = (long *)pVVar21->pArray[lVar31];
                if (((*(uint *)((long)plVar2 + 0x14) & 0xf) == 8) &&
                   (pAVar17 = *(Abc_Obj_t **)
                               (*(long *)(*(long *)(*plVar2 + 0x20) + 8) +
                               (long)*(int *)plVar2[6] * 8), (pAVar17->field_6).pTemp == (void *)0x0
                   )) {
                  pcVar28 = Abc_ObjName(pAVar17);
                  Abc_ObjAssignName(pAVar17,pcVar28,(char *)0x0);
                  pAVar11 = (Abc_Obj_t *)pAVar17->pNtk->vObjs->pArray[*(pAVar17->vFanins).pArray];
                  pcVar28 = Abc_ObjName(pAVar17);
                  Abc_ObjAssignName(pAVar11,pcVar28,"L");
                  plVar2 = (long *)pAVar17->pNtk->vObjs->pArray[*(pAVar17->vFanins).pArray];
                  pAVar34 = *(Abc_Obj_t **)
                             (*(long *)(*(long *)(*plVar2 + 0x20) + 8) + (long)*(int *)plVar2[4] * 8
                             );
                  pcVar28 = Abc_ObjName(pAVar17);
                  pAVar11 = local_60;
                  Abc_ObjAssignName(pAVar34,pcVar28,"_in");
                }
                lVar31 = lVar31 + 1;
                pVVar21 = local_90->vBoxes;
              } while (lVar31 < pVVar21->nSize);
            }
            pVVar21 = local_90->vPos;
            if (0 < pVVar21->nSize) {
              lVar31 = 0;
              do {
                pAVar17 = (Abc_Obj_t *)pVVar21->pArray[lVar31];
                if ((pAVar17->field_6).pTemp == (void *)0x0) {
                  pcVar28 = Abc_ObjName(pAVar17);
                  Abc_ObjAssignName(pAVar17,pcVar28,(char *)0x0);
                }
                lVar31 = lVar31 + 1;
                pVVar21 = local_90->vPos;
              } while (lVar31 < pVVar21->nSize);
            }
          }
          else {
            local_98 = pAVar16;
            Abc_NtkShortNames(pAVar12);
          }
          pAVar12 = local_90;
          pAVar17 = (Abc_Obj_t *)((long)&pAVar16->pNtk + 1);
          local_98 = pAVar16;
          if ((((pAVar17 < local_78) && (*(byte *)&pAVar16->pNtk == 99)) &&
              (local_98 = pAVar17, *(byte *)&pAVar17->pNtk == 0x6e)) &&
             (pAVar17 = (Abc_Obj_t *)((long)&pAVar16->pNtk + 2), local_98 = pAVar17,
             *(byte *)((long)&pAVar16->pNtk + 2) != 0)) {
            if (local_90->pName != (char *)0x0) {
              free(local_90->pName);
              pAVar12->pName = (char *)0x0;
            }
            pcVar28 = Extra_UtilStrsav((char *)pAVar17);
            pAVar12->pName = pcVar28;
          }
          if (pAVar11 != (Abc_Obj_t *)0x0) {
            free(pAVar11);
          }
          uVar26 = local_54;
          iVar5 = local_68;
          pFVar10 = local_88;
          if (*(void **)((long)local_88 + 8) != (void *)0x0) {
            free(*(void **)((long)local_88 + 8));
            *(uint *)&pFVar10->_IO_read_ptr = 0;
            *(uint *)((long)&pFVar10->_IO_read_ptr + 4) = 0;
          }
          free(pFVar10);
          Abc_AigCleanup((Abc_Aig_t *)pAVar12->pManFunc);
          if ((~(byte)local_44 & uVar26 == 0) == 0) {
            Abc_NtkInvertConstraints(pAVar12);
          }
          if (iVar5 != 0) {
            iVar5 = Abc_NtkCheckRead(pAVar12);
            if (iVar5 == 0) {
              puts("Io_ReadAiger: The network check has failed.");
              Abc_NtkDelete(pAVar12);
              return (Abc_Ntk_t *)0x0;
            }
            return pAVar12;
          }
          return pAVar12;
        }
        pcVar28 = "Reading AIGER files with liveness properties is currently not supported.\n";
        sVar9 = 0x49;
      }
      else {
        pcVar28 = "The number of objects does not match.\n";
        sVar9 = 0x26;
      }
    }
    else {
      pcVar28 = "The parameter line is in a wrong format.\n";
      sVar9 = 0x29;
    }
    fwrite(pcVar28,sVar9,1,_stdout);
    pAVar11 = local_60;
  }
  else {
    fwrite("Wrong input file format.\n",0x19,1,_stdout);
  }
  if (pAVar11 != (Abc_Obj_t *)0x0) {
    free(pAVar11);
  }
  return (Abc_Ntk_t *)0x0;
code_r0x0087cfac:
  pAVar17 = (Abc_Obj_t *)((long)&pAVar17->pNtk + 1);
  goto LAB_0087cf9e;
}

Assistant:

Abc_Ntk_t * Io_ReadAiger( char * pFileName, int fCheck )
{
    ProgressBar * pProgress;
    FILE * pFile;
    Vec_Ptr_t * vNodes, * vTerms;
    Vec_Int_t * vLits = NULL;
    Abc_Obj_t * pObj, * pNode0, * pNode1;
    Abc_Ntk_t * pNtkNew;
    int nTotal, nInputs, nOutputs, nLatches, nAnds;
    int nBad = 0, nConstr = 0, nJust = 0, nFair = 0;
    int nFileSize = -1, iTerm, nDigits, i;
    char * pContents, * pDrivers = NULL, * pSymbols, * pCur, * pName, * pType;
    unsigned uLit0, uLit1, uLit;
    int RetValue;

    // read the file into the buffer
    if ( !strncmp(pFileName+strlen(pFileName)-4,".bz2",4) )
        pContents = Ioa_ReadLoadFileBz2Aig( pFileName, &nFileSize );
    else if ( !strncmp(pFileName+strlen(pFileName)-3,".gz",3) )
        pContents = Ioa_ReadLoadFileGzAig( pFileName, &nFileSize );
    else
    {
//        pContents = Ioa_ReadLoadFile( pFileName );
        nFileSize = Extra_FileSize( pFileName );
        pFile = fopen( pFileName, "rb" );
        pContents = ABC_ALLOC( char, nFileSize );
        RetValue = fread( pContents, nFileSize, 1, pFile );
        fclose( pFile );
    }


    // check if the input file format is correct
    if ( strncmp(pContents, "aig", 3) != 0 || (pContents[3] != ' ' && pContents[3] != '2') )
    {
        fprintf( stdout, "Wrong input file format.\n" );
        ABC_FREE( pContents );
        return NULL;
    }

    // read the parameters (M I L O A + B C J F)
    pCur = pContents;         while ( *pCur != ' ' ) pCur++; pCur++;
    // read the number of objects
    nTotal = atoi( pCur );    while ( *pCur != ' ' ) pCur++; pCur++;
    // read the number of inputs
    nInputs = atoi( pCur );   while ( *pCur != ' ' ) pCur++; pCur++;
    // read the number of latches
    nLatches = atoi( pCur );  while ( *pCur != ' ' ) pCur++; pCur++;
    // read the number of outputs
    nOutputs = atoi( pCur );  while ( *pCur != ' ' ) pCur++; pCur++;
    // read the number of nodes
    nAnds = atoi( pCur );     while ( *pCur != ' ' && *pCur != '\n' ) pCur++; 
    if ( *pCur == ' ' )
    {
//        assert( nOutputs == 0 );
        // read the number of properties
        pCur++;
        nBad = atoi( pCur );     while ( *pCur != ' ' && *pCur != '\n' ) pCur++; 
        nOutputs += nBad;
    }
    if ( *pCur == ' ' )
    {
        // read the number of properties
        pCur++;
        nConstr = atoi( pCur );     while ( *pCur != ' ' && *pCur != '\n' ) pCur++; 
        nOutputs += nConstr;
    }
    if ( *pCur == ' ' )
    {
        // read the number of properties
        pCur++;
        nJust = atoi( pCur );     while ( *pCur != ' ' && *pCur != '\n' ) pCur++; 
        nOutputs += nJust;
    }
    if ( *pCur == ' ' )
    {
        // read the number of properties
        pCur++;
        nFair = atoi( pCur );     while ( *pCur != ' ' && *pCur != '\n' ) pCur++; 
        nOutputs += nFair;
    }
    if ( *pCur != '\n' )
    {
        fprintf( stdout, "The parameter line is in a wrong format.\n" );
        ABC_FREE( pContents );
        return NULL;
    }
    pCur++;

    // check the parameters
    if ( nTotal != nInputs + nLatches + nAnds )
    {
        fprintf( stdout, "The number of objects does not match.\n" );
        ABC_FREE( pContents );
        return NULL;
    }
    if ( nJust || nFair )
    {
        fprintf( stdout, "Reading AIGER files with liveness properties is currently not supported.\n" );
        ABC_FREE( pContents );
        return NULL;
    }

    if ( nConstr )
    {
        if ( nConstr == 1 )
            fprintf( stdout, "Warning: The last output is interpreted as a constraint.\n" );
        else
            fprintf( stdout, "Warning: The last %d outputs are interpreted as constraints.\n", nConstr );
    }

    // allocate the empty AIG
    pNtkNew = Abc_NtkAlloc( ABC_NTK_STRASH, ABC_FUNC_AIG, 1 );
    pName = Extra_FileNameGeneric( pFileName );
    pNtkNew->pName = Extra_UtilStrsav( pName );
    pNtkNew->pSpec = Extra_UtilStrsav( pFileName );
    ABC_FREE( pName );
    pNtkNew->nConstrs = nConstr;

    // prepare the array of nodes
    vNodes = Vec_PtrAlloc( 1 + nInputs + nLatches + nAnds );
    Vec_PtrPush( vNodes, Abc_ObjNot( Abc_AigConst1(pNtkNew) ) );

    // create the PIs
    for ( i = 0; i < nInputs; i++ )
    {
        pObj = Abc_NtkCreatePi(pNtkNew);    
        Vec_PtrPush( vNodes, pObj );
    }
    // create the POs
    for ( i = 0; i < nOutputs; i++ )
    {
        pObj = Abc_NtkCreatePo(pNtkNew);   
    }
    // create the latches
    nDigits = Abc_Base10Log( nLatches );
    for ( i = 0; i < nLatches; i++ )
    {
        pObj = Abc_NtkCreateLatch(pNtkNew);
        Abc_LatchSetInit0( pObj );
        pNode0 = Abc_NtkCreateBi(pNtkNew);
        pNode1 = Abc_NtkCreateBo(pNtkNew);
        Abc_ObjAddFanin( pObj, pNode0 );
        Abc_ObjAddFanin( pNode1, pObj );
        Vec_PtrPush( vNodes, pNode1 );
        // assign names to latch and its input
//        Abc_ObjAssignName( pObj, Abc_ObjNameDummy("_L", i, nDigits), NULL );
//        printf( "Creating latch %s with input %d and output %d.\n", Abc_ObjName(pObj), pNode0->Id, pNode1->Id );
    } 
    

    if ( pContents[3] == ' ' ) // standard AIGER
    {
        // remember the beginning of latch/PO literals
        pDrivers = pCur;
        // scroll to the beginning of the binary data
        for ( i = 0; i < nLatches + nOutputs; )
            if ( *pCur++ == '\n' )
                i++;
    }
    else // modified AIGER
    { 
        vLits = Io_WriteDecodeLiterals( &pCur, nLatches + nOutputs );
    }

    // create the AND gates
    pProgress = Extra_ProgressBarStart( stdout, nAnds );
    for ( i = 0; i < nAnds; i++ )
    {
        Extra_ProgressBarUpdate( pProgress, i, NULL );
        uLit = ((i + 1 + nInputs + nLatches) << 1);
        uLit1 = uLit  - Io_ReadAigerDecode( &pCur );
        uLit0 = uLit1 - Io_ReadAigerDecode( &pCur );
//        assert( uLit1 > uLit0 );
        pNode0 = Abc_ObjNotCond( (Abc_Obj_t *)Vec_PtrEntry(vNodes, uLit0 >> 1), uLit0 & 1 );
        pNode1 = Abc_ObjNotCond( (Abc_Obj_t *)Vec_PtrEntry(vNodes, uLit1 >> 1), uLit1 & 1 );
        assert( Vec_PtrSize(vNodes) == i + 1 + nInputs + nLatches );
        Vec_PtrPush( vNodes, Abc_AigAnd((Abc_Aig_t *)pNtkNew->pManFunc, pNode0, pNode1) );
    }
    Extra_ProgressBarStop( pProgress );

    // remember the place where symbols begin
    pSymbols = pCur;

    // read the latch driver literals
    pCur = pDrivers;
    if ( pContents[3] == ' ' ) // standard AIGER
    {
        Abc_NtkForEachLatchInput( pNtkNew, pObj, i )
        {
            uLit0 = atoi( pCur );  while ( *pCur != ' ' && *pCur != '\n' ) pCur++; 
            if ( *pCur == ' ' ) // read initial value
            {
                int Init;
                pCur++;
                Init = atoi( pCur );
                if ( Init == 0 )
                    Abc_LatchSetInit0( Abc_NtkBox(pNtkNew, i) );
                else if ( Init == 1 )
                    Abc_LatchSetInit1( Abc_NtkBox(pNtkNew, i) );
                else 
                {
                    assert( Init == Abc_Var2Lit(1+Abc_NtkPiNum(pNtkNew)+i, 0) ); 
                    // unitialized value of the latch is the latch literal according to http://fmv.jku.at/hwmcc11/beyond1.pdf
                    Abc_LatchSetInitDc( Abc_NtkBox(pNtkNew, i) );
                }
                while ( *pCur != ' ' && *pCur != '\n' ) pCur++;
            }
            if ( *pCur != '\n' )
            {
                fprintf( stdout, "The initial value of latch number %d is not recongnized.\n", i );
                return NULL;
            }
            pCur++;

            pNode0 = Abc_ObjNotCond( (Abc_Obj_t *)Vec_PtrEntry(vNodes, uLit0 >> 1), (uLit0 & 1) );//^ (uLit0 < 2) );
            Abc_ObjAddFanin( pObj, pNode0 );
        }
        // read the PO driver literals
        Abc_NtkForEachPo( pNtkNew, pObj, i )
        {
            uLit0 = atoi( pCur );  while ( *pCur++ != '\n' );
            pNode0 = Abc_ObjNotCond( (Abc_Obj_t *)Vec_PtrEntry(vNodes, uLit0 >> 1), (uLit0 & 1) );//^ (uLit0 < 2) );
            Abc_ObjAddFanin( pObj, pNode0 );
        }
    }
    else
    {
        // read the latch driver literals
        Abc_NtkForEachLatchInput( pNtkNew, pObj, i )
        {
            uLit0 = Vec_IntEntry( vLits, i );
            pNode0 = Abc_ObjNotCond( (Abc_Obj_t *)Vec_PtrEntry(vNodes, uLit0 >> 1), (uLit0 & 1) );
            Abc_ObjAddFanin( pObj, pNode0 );
        }
        // read the PO driver literals
        Abc_NtkForEachPo( pNtkNew, pObj, i )
        {
            uLit0 = Vec_IntEntry( vLits, i+Abc_NtkLatchNum(pNtkNew) );
            pNode0 = Abc_ObjNotCond( (Abc_Obj_t *)Vec_PtrEntry(vNodes, uLit0 >> 1), (uLit0 & 1) );
            Abc_ObjAddFanin( pObj, pNode0 );
        }
        Vec_IntFree( vLits );
    }
 
    // read the names if present
    pCur = pSymbols;
    if ( pCur < pContents + nFileSize && *pCur != 'c' )
    {
        int Counter = 0;
        while ( pCur < pContents + nFileSize && *pCur != 'c' )
        {
            // get the terminal type
            pType = pCur;
            if ( *pCur == 'i' )
                vTerms = pNtkNew->vPis;
            else if ( *pCur == 'l' )
                vTerms = pNtkNew->vBoxes;
            else if ( *pCur == 'o' || *pCur == 'b' || *pCur == 'c' || *pCur == 'j' || *pCur == 'f' )
                vTerms = pNtkNew->vPos;
            else
            {
//                fprintf( stdout, "Wrong terminal type.\n" );
                return NULL;
            }
            // get the terminal number
            iTerm = atoi( ++pCur );  while ( *pCur++ != ' ' );
            // get the node
            if ( iTerm >= Vec_PtrSize(vTerms) )
            {
                fprintf( stdout, "The number of terminal is out of bound.\n" );
                return NULL;
            }
            pObj = (Abc_Obj_t *)Vec_PtrEntry( vTerms, iTerm );
            if ( *pType == 'l' )
                pObj = Abc_ObjFanout0(pObj);
            // assign the name
            pName = pCur;          while ( *pCur++ != '\n' );
            // assign this name 
            *(pCur-1) = 0;
            Abc_ObjAssignName( pObj, pName, NULL );
            if ( *pType == 'l' )
            {
                Abc_ObjAssignName( Abc_ObjFanin0(pObj), Abc_ObjName(pObj), "L" );
                Abc_ObjAssignName( Abc_ObjFanin0(Abc_ObjFanin0(pObj)), Abc_ObjName(pObj), "_in" );
            }
            // mark the node as named
            pObj->pCopy = (Abc_Obj_t *)Abc_ObjName(pObj);
        } 

        // assign the remaining names
        Abc_NtkForEachPi( pNtkNew, pObj, i )
        {
            if ( pObj->pCopy ) continue;
            Abc_ObjAssignName( pObj, Abc_ObjName(pObj), NULL );
            Counter++;
        }
        Abc_NtkForEachLatchOutput( pNtkNew, pObj, i )
        {
            if ( pObj->pCopy ) continue;
            Abc_ObjAssignName( pObj, Abc_ObjName(pObj), NULL );
            Abc_ObjAssignName( Abc_ObjFanin0(pObj), Abc_ObjName(pObj), "L" );
            Abc_ObjAssignName( Abc_ObjFanin0(Abc_ObjFanin0(pObj)), Abc_ObjName(pObj), "_in" );
            Counter++;
        }
        Abc_NtkForEachPo( pNtkNew, pObj, i )
        {
            if ( pObj->pCopy ) continue;
            Abc_ObjAssignName( pObj, Abc_ObjName(pObj), NULL );
            Counter++;
        }
//        if ( Counter )
//            printf( "Io_ReadAiger(): Added %d default names for nameless I/O/register objects.\n", Counter );
    }
    else
    {
//        printf( "Io_ReadAiger(): I/O/register names are not given. Generating short names.\n" );
        Abc_NtkShortNames( pNtkNew );
    }

    // read the name of the model if given
    pCur = pSymbols;
    if ( pCur + 1 < pContents + nFileSize && *pCur == 'c' )
    {
        pCur++;
        if ( *pCur == 'n' )
        {
            pCur++;
            // read model name
            if ( strlen(pCur) > 0 )
            {
                ABC_FREE( pNtkNew->pName );
                pNtkNew->pName = Extra_UtilStrsav( pCur );
            }
        }
    }

    // skipping the comments
    ABC_FREE( pContents );
    Vec_PtrFree( vNodes );

    // remove the extra nodes
    Abc_AigCleanup( (Abc_Aig_t *)pNtkNew->pManFunc );

    // update polarity of the additional outputs
    if ( nBad || nConstr || nJust || nFair )
        Abc_NtkInvertConstraints( pNtkNew );

    // check the result
    if ( fCheck && !Abc_NtkCheckRead( pNtkNew ) )
    {
        printf( "Io_ReadAiger: The network check has failed.\n" );
        Abc_NtkDelete( pNtkNew );
        return NULL;
    }
    return pNtkNew;
}